

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  size_t sVar1;
  Exception *this_00;
  Type in_ECX;
  int in_EDX;
  DescriptionStyle in_R8D;
  char *in_R9;
  char *pcVar2;
  char *in_stack_00000008;
  String *in_stack_00000010;
  size_t in_stack_ffffffffffffffa8;
  String local_48;
  
  pcVar2 = in_R9;
  this_00 = (Exception *)operator_new(0x158);
  argValues.size_ = in_stack_ffffffffffffffa8;
  argValues.ptr = in_stack_00000010;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,(anon_unknown_2 *)0x1,in_R8D,(char *)0x0,(int)in_R9,pcVar2,in_stack_00000008,
             argValues);
  Exception::Exception(this_00,in_ECX,(char *)ctx,in_EDX,&local_48);
  sVar1 = local_48.content.size_;
  pcVar2 = local_48.content.ptr;
  this->exception = this_00;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    this = (Fault *)(*(code *)**(undefined8 **)local_48.content.disposer)
                              (local_48.content.disposer,pcVar2,1,sVar1,sVar1,0);
  }
  return (int)this;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, Exception::Type type,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(type, file, line,
      makeDescriptionImpl(ASSERTION, condition, 0, nullptr, macroArgs, argValues));
}